

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

void phits_close_file(phits_file_t ff)

{
  long *in_RDI;
  phits_fileinternal_t *f;
  
  if (in_RDI == (long *)0x0) {
    phits_error((char *)0x102ec7);
  }
  if (*in_RDI != 0) {
    mcpl_generic_fclose(in_RDI);
    *in_RDI = 0;
  }
  free(in_RDI);
  return;
}

Assistant:

void phits_close_file(phits_file_t ff)
{
  phits_fileinternal_t * f = (phits_fileinternal_t *)ff.internal;
  if (!f)
    phits_error("Invalid file object passed to phits_close_file");
  if ( f->filehandle.internal ) {
    mcpl_generic_fclose( &f->filehandle );
    f->filehandle.internal = NULL;
  }
  free(f);
  ff.internal = 0;
}